

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O0

int func(N_Vector cc,N_Vector fval,void *user_data)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  UserData data;
  int idxl;
  int idxr;
  int idyl;
  int idyu;
  int is;
  int jy;
  int jx;
  sunrealtype dcxri;
  sunrealtype dcxli;
  sunrealtype dcyui;
  sunrealtype dcyli;
  sunrealtype *fxy;
  sunrealtype *rxy;
  sunrealtype *cxy;
  sunrealtype dely;
  sunrealtype delx;
  sunrealtype yy;
  sunrealtype xx;
  int in_stack_ffffffffffffff84;
  int iVar12;
  int iVar13;
  sunrealtype *in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa0;
  
  for (iVar12 = 0; iVar12 < 5; iVar12 = iVar12 + 1) {
    iVar3 = -0x1e;
    if (iVar12 != 0) {
      iVar3 = 0x1e;
    }
    iVar4 = -0x1e;
    if (iVar12 != 4) {
      iVar4 = 0x1e;
    }
    for (iVar13 = 0; iVar13 < 5; iVar13 = iVar13 + 1) {
      iVar5 = -6;
      if (iVar13 != 0) {
        iVar5 = 6;
      }
      iVar6 = -6;
      if (iVar13 != 4) {
        iVar6 = 6;
      }
      lVar7 = *(long *)(*in_RDI + 0x10) + (long)(iVar13 * 6 + iVar12 * 0x1e) * 8;
      lVar1 = *(long *)(**(long **)(in_RDX + 0x1a0) + 0x10);
      iVar8 = iVar13 * 6;
      iVar10 = iVar12 * 0x1e;
      lVar2 = *(long *)(*in_RSI + 0x10);
      iVar9 = iVar13 * 6;
      iVar11 = iVar12 * 0x1e;
      WebRate(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
              (sunrealtype *)CONCAT44(iVar13,iVar12),
              (void *)CONCAT44(in_stack_ffffffffffffff84,iVar4));
      for (in_stack_ffffffffffffff84 = 0; in_stack_ffffffffffffff84 < 6;
          in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1) {
        in_stack_ffffffffffffffa0 =
             *(double *)(lVar7 + (long)iVar4 * 8 + (long)in_stack_ffffffffffffff84 * 8) -
             *(double *)(lVar7 + (long)in_stack_ffffffffffffff84 * 8);
        in_stack_ffffffffffffff98 =
             *(double *)(lVar7 + (long)in_stack_ffffffffffffff84 * 8) -
             *(double *)(lVar7 + (long)iVar5 * -8 + (long)in_stack_ffffffffffffff84 * 8);
        in_stack_ffffffffffffff90 =
             (sunrealtype *)
             (*(double *)(lVar7 + (long)iVar6 * 8 + (long)in_stack_ffffffffffffff84 * 8) -
             *(double *)(lVar7 + (long)in_stack_ffffffffffffff84 * 8));
        *(double *)(lVar2 + (long)(iVar9 + iVar11) * 8 + (long)in_stack_ffffffffffffff84 * 8) =
             *(double *)(*(long *)(in_RDX + 0x1b0) + (long)in_stack_ffffffffffffff84 * 8) *
             (in_stack_ffffffffffffffa0 -
             (*(double *)(lVar7 + (long)in_stack_ffffffffffffff84 * 8) -
             *(double *)(lVar7 + (long)iVar3 * -8 + (long)in_stack_ffffffffffffff84 * 8))) +
             *(double *)(*(long *)(in_RDX + 0x1a8) + (long)in_stack_ffffffffffffff84 * 8) *
             ((double)in_stack_ffffffffffffff90 - in_stack_ffffffffffffff98) +
             *(double *)(lVar1 + (long)(iVar8 + iVar10) * 8 + (long)in_stack_ffffffffffffff84 * 8);
      }
    }
  }
  return 0;
}

Assistant:

static int func(N_Vector cc, N_Vector fval, void* user_data)
{
  sunrealtype xx, yy, delx, dely, *cxy, *rxy, *fxy, dcyli, dcyui, dcxli, dcxri;
  int jx, jy, is, idyu, idyl, idxr, idxl;
  UserData data;

  data = (UserData)user_data;
  delx = data->dx;
  dely = data->dy;

  /* Loop over all mesh points, evaluating rate array at each point*/
  for (jy = 0; jy < MY; jy++)
  {
    yy = dely * jy;

    /* Set lower/upper index shifts, special at boundaries. */
    idyl = (jy != 0) ? NSMX : -NSMX;
    idyu = (jy != MY - 1) ? NSMX : -NSMX;

    for (jx = 0; jx < MX; jx++)
    {
      xx = delx * jx;

      /* Set left/right index shifts, special at boundaries. */
      idxl = (jx != 0) ? NUM_SPECIES : -NUM_SPECIES;
      idxr = (jx != MX - 1) ? NUM_SPECIES : -NUM_SPECIES;

      cxy = IJ_Vptr(cc, jx, jy);
      rxy = IJ_Vptr(data->rates, jx, jy);
      fxy = IJ_Vptr(fval, jx, jy);

      /* Get species interaction rate array at (xx,yy) */
      WebRate(xx, yy, cxy, rxy, user_data);

      for (is = 0; is < NUM_SPECIES; is++)
      {
        /* Differencing in x direction */
        dcyli = *(cxy + is) - *(cxy - idyl + is);
        dcyui = *(cxy + idyu + is) - *(cxy + is);

        /* Differencing in y direction */
        dcxli = *(cxy + is) - *(cxy - idxl + is);
        dcxri = *(cxy + idxr + is) - *(cxy + is);

        /* Compute the total rate value at (xx,yy) */
        fxy[is] = (coy)[is] * (dcyui - dcyli) + (cox)[is] * (dcxri - dcxli) +
                  rxy[is];

      } /* end of is loop */

    } /* end of jx loop */

  } /* end of jy loop */

  return (0);
}